

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

Node * __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::searchEdgeLeftOfEdge
          (SimpleToMonotone *this,int edgeIndex)

{
  bool bVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar2 = (this->m_edgeList).root;
  if (pNVar2 == (Node *)0x0) {
    pNVar3 = (Node *)0x0;
  }
  else {
    pNVar3 = (Node *)0x0;
    do {
      bVar1 = edgeIsLeftOfEdge(this,edgeIndex,pNVar2->data);
      if (!bVar1) {
        pNVar3 = pNVar2;
      }
      pNVar2 = (&pNVar2->left)[!bVar1];
    } while (pNVar2 != (Node *)0x0);
  }
  return pNVar3;
}

Assistant:

QRBTree<int>::Node *QTriangulator<T>::SimpleToMonotone::searchEdgeLeftOfEdge(int edgeIndex) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    QRBTree<int>::Node *result = nullptr;
    while (current) {
        if (edgeIsLeftOfEdge(edgeIndex, current->data)) {
            current = current->left;
        } else {
            result = current;
            current = current->right;
        }
    }
    return result;
}